

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

Constant * __thiscall soul::heart::Allocator::allocateZeroInitialiser(Allocator *this,Type *type)

{
  Constant *pCVar1;
  Type TStack_68;
  Value local_50;
  
  Type::Type(&TStack_68,type);
  soul::Value::zeroInitialiser(&local_50,&TStack_68);
  pCVar1 = allocateConstant(this,&local_50);
  soul::Value::~Value(&local_50);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_68.structure);
  return pCVar1;
}

Assistant:

Constant& allocateZeroInitialiser (const Type& type)  { return allocateConstant (Value::zeroInitialiser (type)); }